

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traceback.c
# Opt level: O2

parasail_traceback_t *
parasail_result_get_traceback_extra
          (parasail_result_t *result,char *seqA,int lena,char *seqB,int lenb,
          parasail_matrix_t *matrix,char match,char pos,char neg,int case_sensitive,
          char *alphabet_aliases)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  long lVar10;
  __int32_t **pp_Var11;
  parasail_traceback_t *ppVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  long lVar24;
  char *pcVar25;
  char *pcVar26;
  size_t sVar27;
  ulong uVar28;
  size_t sVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  char *local_1d8;
  ulong local_1d0;
  char *local_1c0;
  char *local_1b8;
  long local_198;
  size_t local_190;
  char *local_178;
  int local_168;
  char local_138 [264];
  
  iVar9 = parasail_result_is_trace(result);
  if (iVar9 == 0) {
    pcVar13 = "parasail_result_get_traceback_extra";
    pcVar21 = "parasail_result_is_trace(result)";
    goto LAB_004ea2f9;
  }
  uVar3 = result->flag;
  lVar19 = (long)lena;
  lVar14 = (long)lenb;
  if ((uVar3 & 0xc00) == 0) {
    sVar29 = (size_t)(lena + lenb + 1);
    local_1b8 = (char *)malloc(sVar29);
    local_1c0 = (char *)malloc(sVar29);
    local_178 = (char *)malloc(sVar29);
    iVar9 = result->end_query;
    uVar28 = (ulong)iVar9;
    iVar4 = result->end_ref;
    piVar5 = ((result->field_4).rowcols)->score_row;
    if (alphabet_aliases == (char *)0x0) {
      local_190 = 0;
    }
    else {
      local_190 = strlen(alphabet_aliases);
      if ((local_190 & 0xffffffffffffff01) != 0) {
        pcVar13 = "parasail_result_get_traceback_8";
        goto LAB_004ea2d1;
      }
      for (sVar29 = 0; local_190 != sVar29; sVar29 = sVar29 + 1) {
        if (case_sensitive == 0) {
          pp_Var11 = __ctype_toupper_loc();
          cVar8 = (char)(*pp_Var11)[alphabet_aliases[sVar29]];
        }
        else {
          cVar8 = alphabet_aliases[sVar29];
        }
        local_138[sVar29] = cVar8;
      }
    }
    pcVar13 = local_1c0;
    pcVar21 = local_178;
    pcVar26 = local_1b8;
    if ((uVar3 & 2) == 0) {
LAB_004e8c8b:
      lVar19 = uVar28 + 1;
      lVar10 = uVar28 << 0x20;
      iVar9 = 4;
      uVar16 = (long)iVar4;
      while( true ) {
        pcVar22 = seqB + uVar16;
        lVar18 = 0;
        pcVar23 = pcVar13;
        pcVar20 = pcVar21;
        uVar15 = uVar16;
        pcVar25 = pcVar26;
        while( true ) {
          lVar24 = uVar28 * lVar14 + uVar15;
          while( true ) {
            if ((long)(uVar28 & uVar15) < 0) goto LAB_004e9227;
            if ((long)uVar28 < 0) {
              if (((result->flag & 4) == 0) && (-1 < (long)uVar15)) {
                do {
                  pcVar26[lVar18] = '-';
                  pcVar13[lVar18] = *pcVar22;
                  pcVar21[lVar18] = ' ';
                  lVar18 = lVar18 + 1;
                  pcVar22 = pcVar22 + -1;
                } while (uVar16 + 1 != lVar18);
                pcVar23 = pcVar13 + lVar18;
                pcVar20 = pcVar21 + lVar18;
                pcVar25 = pcVar26 + lVar18;
              }
              goto LAB_004e9227;
            }
            if ((long)uVar15 < 0) {
              if ((result->flag & 4) == 0) {
                do {
                  if (seqA == (char *)0x0) {
                    cVar8 = '*';
                  }
                  else {
                    cVar8 = seqA[lVar10 >> 0x20];
                  }
                  *pcVar25 = cVar8;
                  pcVar25 = pcVar25 + 1;
                  *pcVar23 = '-';
                  pcVar23 = pcVar23 + 1;
                  *pcVar20 = ' ';
                  pcVar20 = pcVar20 + 1;
                  lVar10 = lVar10 + -0x100000000;
                  lVar14 = lVar19 + -1;
                  bVar7 = 0 < lVar19;
                  lVar19 = lVar14;
                } while (lVar14 != 0 && bVar7);
              }
              goto LAB_004e9227;
            }
            local_168 = (int)uVar28;
            if (iVar9 != 4) break;
            bVar1 = *(byte *)((long)piVar5 + lVar24);
            if ((bVar1 & 4) != 0) {
              if (seqA == (char *)0x0) {
                cVar8 = '*';
              }
              else {
                cVar8 = seqA[local_168];
              }
              *pcVar25 = cVar8;
              *pcVar23 = seqB[uVar15];
              cVar8 = match_char(seqA,local_168,seqB,(int)uVar15,matrix,match,pos,neg,case_sensitive
                                 ,local_138,local_190);
              *pcVar20 = cVar8;
              uVar15 = uVar15 - 1;
              iVar9 = 4;
              goto LAB_004e8e65;
            }
            iVar9 = 1;
            if (((bVar1 & 1) == 0) && (iVar9 = 2, (bVar1 & 2) == 0)) goto LAB_004e9227;
          }
          if (iVar9 != 1) break;
          *pcVar25 = '-';
          *pcVar23 = seqB[uVar15];
          *pcVar20 = ' ';
          iVar9 = 4;
          if (((*(byte *)((long)piVar5 + lVar24) & 8) == 0) &&
             (iVar9 = 1, (*(byte *)((long)piVar5 + lVar24) & 0x10) == 0)) goto LAB_004ea08f;
          pcVar25 = pcVar25 + 1;
          pcVar23 = pcVar23 + 1;
          pcVar20 = pcVar20 + 1;
          uVar15 = uVar15 - 1;
          lVar18 = lVar18 + 1;
          pcVar22 = pcVar22 + -1;
        }
        if (iVar9 != 2) break;
        if (seqA == (char *)0x0) {
          cVar8 = '*';
        }
        else {
          cVar8 = seqA[local_168];
        }
        *pcVar25 = cVar8;
        *pcVar23 = '-';
        *pcVar20 = ' ';
        if ((*(byte *)((long)piVar5 + lVar24) & 0x20) == 0) {
          iVar9 = 2;
          if ((*(byte *)((long)piVar5 + lVar24) & 0x40) == 0) break;
        }
        else {
          iVar9 = 4;
        }
LAB_004e8e65:
        pcVar26 = pcVar25 + 1;
        uVar28 = uVar28 - 1;
        pcVar21 = pcVar20 + 1;
        pcVar13 = pcVar23 + 1;
        lVar19 = lVar19 + -1;
        lVar10 = lVar10 + -0x100000000;
        uVar16 = uVar15;
      }
    }
    else {
      lVar10 = lVar14;
      if (iVar9 + 1 == lena) {
        while (lVar10 = lVar10 + -1, iVar4 < lVar10) {
          *pcVar26 = '-';
          *pcVar13 = seqB[lVar10];
          *pcVar21 = ' ';
          pcVar13 = pcVar13 + 1;
          pcVar21 = pcVar21 + 1;
          pcVar26 = pcVar26 + 1;
        }
        goto LAB_004e8c8b;
      }
      if (iVar4 + 1 == lenb) {
        while (lVar19 = lVar19 + -1, (long)uVar28 < lVar19) {
          if (seqA == (char *)0x0) {
            cVar8 = '*';
          }
          else {
            cVar8 = seqA[lVar19];
          }
          *pcVar26 = cVar8;
          *pcVar13 = '-';
          *pcVar21 = ' ';
          pcVar13 = pcVar13 + 1;
          pcVar21 = pcVar21 + 1;
          pcVar26 = pcVar26 + 1;
        }
        goto LAB_004e8c8b;
      }
    }
LAB_004ea08f:
    pcVar13 = "parasail_result_get_traceback_8";
  }
  else {
    uVar28 = 8;
    uVar16 = 0x10;
    if ((uVar3 >> 0x14 & 1) == 0) {
      if ((uVar3 >> 0x15 & 1) == 0) {
        if ((uVar3 >> 0x16 & 1) == 0) {
          if ((uVar3 >> 0x17 & 1) == 0) {
            return (parasail_traceback_t *)0x0;
          }
          sVar29 = (size_t)(lena + lenb + 1);
          local_1b8 = (char *)malloc(sVar29);
          local_1c0 = (char *)malloc(sVar29);
          local_178 = (char *)malloc(sVar29);
          uVar15 = (ulong)(uVar3 >> 0x18 & 1);
          if ((uVar3 >> 0x19 & 1) != 0) {
            uVar15 = 2;
          }
          if ((uVar3 >> 0x1a & 1) != 0) {
            uVar15 = 4;
          }
          auVar33._0_4_ = -(uint)((uVar3 & 0x40000000) == 0);
          auVar33._4_4_ = -(uint)((uVar3 & 0x20000000) == 0);
          auVar33._8_4_ = -(uint)((uVar3 & 0x10000000) == 0);
          auVar33._12_4_ = -(uint)((uVar3 & 0x8000000) == 0);
          uVar17 = movmskps(4,auVar33);
          if ((uVar17 & 8) != 0) {
            uVar28 = uVar15;
          }
          if ((uVar17 & 4) != 0) {
            uVar16 = uVar28;
          }
          iVar9 = result->end_query;
          local_1d0 = (ulong)iVar9;
          uVar28 = 0x20;
          if ((uVar17 & 2) != 0) {
            uVar28 = uVar16;
          }
          iVar4 = result->end_ref;
          piVar5 = ((result->field_4).rowcols)->score_row;
          uVar16 = 0x40;
          if ((uVar17 & 1) != 0) {
            uVar16 = uVar28;
          }
          lVar10 = (long)(lVar19 + uVar16 + -1) / (long)uVar16;
          if (alphabet_aliases == (char *)0x0) {
            sVar29 = 0;
          }
          else {
            sVar29 = strlen(alphabet_aliases);
            if ((sVar29 & 0xffffffffffffff01) != 0) {
              pcVar13 = "parasail_result_get_traceback_striped_64";
LAB_004ea2d1:
              pcVar21 = "aliases_size % 2 == 0 && aliases_size < 256";
              goto LAB_004ea2f9;
            }
            for (sVar27 = 0; sVar29 != sVar27; sVar27 = sVar27 + 1) {
              if (case_sensitive == 0) {
                pp_Var11 = __ctype_toupper_loc();
                cVar8 = (char)(*pp_Var11)[alphabet_aliases[sVar27]];
              }
              else {
                cVar8 = alphabet_aliases[sVar27];
              }
              local_138[sVar27] = cVar8;
            }
          }
          pcVar13 = local_1c0;
          pcVar21 = local_178;
          pcVar26 = local_1b8;
          if ((uVar3 & 2) == 0) {
LAB_004e9dcf:
            local_198 = local_1d0 + 1;
            lVar14 = local_1d0 << 0x20;
            iVar9 = 4;
            uVar28 = (long)iVar4;
LAB_004e9dfb:
            pcVar23 = seqB + uVar28;
            lVar19 = 0;
            pcVar20 = pcVar21;
            pcVar25 = pcVar26;
            uVar15 = uVar28;
            local_1d8 = pcVar13;
            do {
LAB_004e9e1d:
              if ((long)(local_1d0 & uVar15) < 0) goto LAB_004ea0f6;
              if ((long)local_1d0 < 0) {
                if (((result->flag & 4) == 0) && (-1 < (long)uVar15)) {
                  do {
                    pcVar26[lVar19] = '-';
                    pcVar13[lVar19] = *pcVar23;
                    pcVar21[lVar19] = ' ';
                    lVar19 = lVar19 + 1;
                    pcVar23 = pcVar23 + -1;
                  } while (uVar28 + 1 != lVar19);
LAB_004ea0e4:
                  local_1d8 = pcVar13 + lVar19;
                  pcVar20 = pcVar21 + lVar19;
                  pcVar25 = pcVar26 + lVar19;
                }
                goto LAB_004ea0f6;
              }
              if ((long)uVar15 < 0) {
                if ((result->flag & 4) == 0) {
                  do {
                    if (seqA == (char *)0x0) {
                      cVar8 = '*';
                    }
                    else {
                      cVar8 = seqA[lVar14 >> 0x20];
                    }
                    *pcVar25 = cVar8;
                    pcVar25 = pcVar25 + 1;
                    *local_1d8 = '-';
                    local_1d8 = local_1d8 + 1;
                    *pcVar20 = ' ';
                    pcVar20 = pcVar20 + 1;
                    lVar14 = lVar14 + -0x100000000;
                    lVar19 = local_198 + -1;
                    bVar7 = 0 < local_198;
                    local_198 = lVar19;
                  } while (lVar19 != 0 && bVar7);
                }
                goto LAB_004ea0f6;
              }
              lVar18 = ((long)local_1d0 % lVar10 + uVar15 * lVar10) * uVar16 +
                       (long)local_1d0 / lVar10;
              if (iVar9 == 4) {
                uVar6 = *(ulong *)(piVar5 + lVar18 * 2);
                if ((uVar6 & 4) != 0) {
                  if (seqA == (char *)0x0) {
                    cVar8 = '*';
                  }
                  else {
                    cVar8 = seqA[(int)local_1d0];
                  }
                  *pcVar25 = cVar8;
                  *local_1d8 = seqB[uVar15];
                  cVar8 = match_char(seqA,(int)local_1d0,seqB,(int)uVar15,matrix,match,pos,neg,
                                     case_sensitive,local_138,sVar29);
                  *pcVar20 = cVar8;
                  uVar15 = uVar15 - 1;
                  iVar9 = 4;
                  goto LAB_004e9fd4;
                }
                iVar9 = 1;
                if (((uVar6 & 1) == 0) && (iVar9 = 2, (uVar6 & 2) == 0)) goto LAB_004ea0f6;
                goto LAB_004e9e1d;
              }
              if (iVar9 != 1) goto LAB_004e9edc;
              *pcVar25 = '-';
              *local_1d8 = seqB[uVar15];
              *pcVar20 = ' ';
              iVar9 = 4;
              if (((*(ulong *)(piVar5 + lVar18 * 2) & 8) == 0) &&
                 (iVar9 = 1, (*(ulong *)(piVar5 + lVar18 * 2) & 0x10) == 0)) goto LAB_004ea2da;
              pcVar25 = pcVar25 + 1;
              local_1d8 = local_1d8 + 1;
              pcVar20 = pcVar20 + 1;
              uVar15 = uVar15 - 1;
              lVar19 = lVar19 + 1;
              pcVar23 = pcVar23 + -1;
            } while( true );
          }
          if (iVar9 + 1 == lena) {
            while (lVar14 = lVar14 + -1, iVar4 < lVar14) {
              *pcVar26 = '-';
              *pcVar13 = seqB[lVar14];
              *pcVar21 = ' ';
              pcVar13 = pcVar13 + 1;
              pcVar21 = pcVar21 + 1;
              pcVar26 = pcVar26 + 1;
            }
            goto LAB_004e9dcf;
          }
          if (iVar4 + 1 == lenb) {
            while (lVar19 = lVar19 + -1, (long)local_1d0 < lVar19) {
              if (seqA == (char *)0x0) {
                cVar8 = '*';
              }
              else {
                cVar8 = seqA[lVar19];
              }
              *pcVar26 = cVar8;
              *pcVar13 = '-';
              *pcVar21 = ' ';
              pcVar13 = pcVar13 + 1;
              pcVar21 = pcVar21 + 1;
              pcVar26 = pcVar26 + 1;
            }
            goto LAB_004e9dcf;
          }
LAB_004ea2da:
          pcVar13 = "parasail_result_get_traceback_striped_64";
        }
        else {
          sVar29 = (size_t)(lena + lenb + 1);
          local_1b8 = (char *)malloc(sVar29);
          local_1c0 = (char *)malloc(sVar29);
          local_178 = (char *)malloc(sVar29);
          uVar15 = (ulong)(uVar3 >> 0x18 & 1);
          if ((uVar3 >> 0x19 & 1) != 0) {
            uVar15 = 2;
          }
          if ((uVar3 >> 0x1a & 1) != 0) {
            uVar15 = 4;
          }
          auVar32._0_4_ = -(uint)((uVar3 & 0x40000000) == 0);
          auVar32._4_4_ = -(uint)((uVar3 & 0x20000000) == 0);
          auVar32._8_4_ = -(uint)((uVar3 & 0x10000000) == 0);
          auVar32._12_4_ = -(uint)((uVar3 & 0x8000000) == 0);
          uVar17 = movmskps(4,auVar32);
          if ((uVar17 & 8) != 0) {
            uVar28 = uVar15;
          }
          if ((uVar17 & 4) != 0) {
            uVar16 = uVar28;
          }
          iVar9 = result->end_query;
          local_1d0 = (ulong)iVar9;
          uVar28 = 0x20;
          if ((uVar17 & 2) != 0) {
            uVar28 = uVar16;
          }
          iVar4 = result->end_ref;
          piVar5 = ((result->field_4).rowcols)->score_row;
          uVar16 = 0x40;
          if ((uVar17 & 1) != 0) {
            uVar16 = uVar28;
          }
          lVar10 = (long)(lVar19 + uVar16 + -1) / (long)uVar16;
          if (alphabet_aliases == (char *)0x0) {
            sVar29 = 0;
          }
          else {
            sVar29 = strlen(alphabet_aliases);
            if ((sVar29 & 0xffffffffffffff01) != 0) {
              pcVar13 = "parasail_result_get_traceback_striped_32";
              goto LAB_004ea2d1;
            }
            for (sVar27 = 0; sVar29 != sVar27; sVar27 = sVar27 + 1) {
              if (case_sensitive == 0) {
                pp_Var11 = __ctype_toupper_loc();
                cVar8 = (char)(*pp_Var11)[alphabet_aliases[sVar27]];
              }
              else {
                cVar8 = alphabet_aliases[sVar27];
              }
              local_138[sVar27] = cVar8;
            }
          }
          pcVar13 = local_1c0;
          pcVar21 = local_178;
          pcVar26 = local_1b8;
          if ((uVar3 & 2) == 0) {
LAB_004e9a29:
            local_198 = local_1d0 + 1;
            lVar14 = local_1d0 << 0x20;
            iVar9 = 4;
            uVar28 = (long)iVar4;
LAB_004e9a55:
            pcVar23 = seqB + uVar28;
            lVar19 = 0;
            pcVar20 = pcVar21;
            pcVar25 = pcVar26;
            uVar15 = uVar28;
            local_1d8 = pcVar13;
            do {
LAB_004e9a77:
              if ((long)(local_1d0 & uVar15) < 0) goto LAB_004ea0f6;
              if ((long)local_1d0 < 0) {
                if (((result->flag & 4) == 0) && (-1 < (long)uVar15)) {
                  do {
                    pcVar26[lVar19] = '-';
                    pcVar13[lVar19] = *pcVar23;
                    pcVar21[lVar19] = ' ';
                    lVar19 = lVar19 + 1;
                    pcVar23 = pcVar23 + -1;
                  } while (uVar28 + 1 != lVar19);
                  goto LAB_004ea0e4;
                }
                goto LAB_004ea0f6;
              }
              if ((long)uVar15 < 0) {
                if ((result->flag & 4) == 0) {
                  do {
                    if (seqA == (char *)0x0) {
                      cVar8 = '*';
                    }
                    else {
                      cVar8 = seqA[lVar14 >> 0x20];
                    }
                    *pcVar25 = cVar8;
                    pcVar25 = pcVar25 + 1;
                    *local_1d8 = '-';
                    local_1d8 = local_1d8 + 1;
                    *pcVar20 = ' ';
                    pcVar20 = pcVar20 + 1;
                    lVar14 = lVar14 + -0x100000000;
                    lVar19 = local_198 + -1;
                    bVar7 = 0 < local_198;
                    local_198 = lVar19;
                  } while (lVar19 != 0 && bVar7);
                }
                goto LAB_004ea0f6;
              }
              lVar18 = ((long)local_1d0 % lVar10 + uVar15 * lVar10) * uVar16 +
                       (long)local_1d0 / lVar10;
              if (iVar9 == 4) {
                uVar3 = piVar5[lVar18];
                if ((uVar3 & 4) == 0) goto code_r0x004e9ac9;
                if (seqA == (char *)0x0) {
                  cVar8 = '*';
                }
                else {
                  cVar8 = seqA[(int)local_1d0];
                }
                *pcVar25 = cVar8;
                *local_1d8 = seqB[uVar15];
                cVar8 = match_char(seqA,(int)local_1d0,seqB,(int)uVar15,matrix,match,pos,neg,
                                   case_sensitive,local_138,sVar29);
                *pcVar20 = cVar8;
                uVar15 = uVar15 - 1;
                iVar9 = 4;
                goto LAB_004e9c2b;
              }
              if (iVar9 != 1) goto LAB_004e9b34;
              *pcVar25 = '-';
              *local_1d8 = seqB[uVar15];
              *pcVar20 = ' ';
              iVar9 = 4;
              if (((piVar5[lVar18] & 8U) == 0) && (iVar9 = 1, (piVar5[lVar18] & 0x10U) == 0))
              goto LAB_004ea29f;
              pcVar25 = pcVar25 + 1;
              local_1d8 = local_1d8 + 1;
              pcVar20 = pcVar20 + 1;
              uVar15 = uVar15 - 1;
              lVar19 = lVar19 + 1;
              pcVar23 = pcVar23 + -1;
            } while( true );
          }
          if (iVar9 + 1 == lena) {
            while (lVar14 = lVar14 + -1, iVar4 < lVar14) {
              *pcVar26 = '-';
              *pcVar13 = seqB[lVar14];
              *pcVar21 = ' ';
              pcVar13 = pcVar13 + 1;
              pcVar21 = pcVar21 + 1;
              pcVar26 = pcVar26 + 1;
            }
            goto LAB_004e9a29;
          }
          if (iVar4 + 1 == lenb) {
            while (lVar19 = lVar19 + -1, (long)local_1d0 < lVar19) {
              if (seqA == (char *)0x0) {
                cVar8 = '*';
              }
              else {
                cVar8 = seqA[lVar19];
              }
              *pcVar26 = cVar8;
              *pcVar13 = '-';
              *pcVar21 = ' ';
              pcVar13 = pcVar13 + 1;
              pcVar21 = pcVar21 + 1;
              pcVar26 = pcVar26 + 1;
            }
            goto LAB_004e9a29;
          }
LAB_004ea29f:
          pcVar13 = "parasail_result_get_traceback_striped_32";
        }
      }
      else {
        sVar29 = (size_t)(lena + lenb + 1);
        local_1b8 = (char *)malloc(sVar29);
        local_1c0 = (char *)malloc(sVar29);
        local_178 = (char *)malloc(sVar29);
        uVar15 = (ulong)(uVar3 >> 0x18 & 1);
        if ((uVar3 >> 0x19 & 1) != 0) {
          uVar15 = 2;
        }
        if ((uVar3 >> 0x1a & 1) != 0) {
          uVar15 = 4;
        }
        auVar31._0_4_ = -(uint)((uVar3 & 0x40000000) == 0);
        auVar31._4_4_ = -(uint)((uVar3 & 0x20000000) == 0);
        auVar31._8_4_ = -(uint)((uVar3 & 0x10000000) == 0);
        auVar31._12_4_ = -(uint)((uVar3 & 0x8000000) == 0);
        uVar17 = movmskps(4,auVar31);
        if ((uVar17 & 8) != 0) {
          uVar28 = uVar15;
        }
        if ((uVar17 & 4) != 0) {
          uVar16 = uVar28;
        }
        iVar9 = result->end_query;
        local_1d0 = (ulong)iVar9;
        uVar28 = 0x20;
        if ((uVar17 & 2) != 0) {
          uVar28 = uVar16;
        }
        iVar4 = result->end_ref;
        piVar5 = ((result->field_4).rowcols)->score_row;
        uVar16 = 0x40;
        if ((uVar17 & 1) != 0) {
          uVar16 = uVar28;
        }
        lVar10 = (long)(lVar19 + uVar16 + -1) / (long)uVar16;
        if (alphabet_aliases == (char *)0x0) {
          sVar29 = 0;
        }
        else {
          sVar29 = strlen(alphabet_aliases);
          if ((sVar29 & 0xffffffffffffff01) != 0) {
            pcVar13 = "parasail_result_get_traceback_striped_16";
            goto LAB_004ea2d1;
          }
          for (sVar27 = 0; sVar29 != sVar27; sVar27 = sVar27 + 1) {
            if (case_sensitive == 0) {
              pp_Var11 = __ctype_toupper_loc();
              cVar8 = (char)(*pp_Var11)[alphabet_aliases[sVar27]];
            }
            else {
              cVar8 = alphabet_aliases[sVar27];
            }
            local_138[sVar27] = cVar8;
          }
        }
        pcVar13 = local_1c0;
        pcVar21 = local_178;
        pcVar26 = local_1b8;
        if ((uVar3 & 2) == 0) {
LAB_004e954e:
          local_198 = local_1d0 + 1;
          lVar14 = local_1d0 << 0x20;
          iVar9 = 4;
          uVar28 = (long)iVar4;
LAB_004e957a:
          pcVar23 = seqB + uVar28;
          lVar19 = 0;
          pcVar20 = pcVar21;
          pcVar25 = pcVar26;
          uVar15 = uVar28;
          local_1d8 = pcVar13;
          do {
LAB_004e959c:
            if ((long)(local_1d0 & uVar15) < 0) goto LAB_004ea0f6;
            if ((long)local_1d0 < 0) {
              if (((result->flag & 4) == 0) && (-1 < (long)uVar15)) {
                do {
                  pcVar26[lVar19] = '-';
                  pcVar13[lVar19] = *pcVar23;
                  pcVar21[lVar19] = ' ';
                  lVar19 = lVar19 + 1;
                  pcVar23 = pcVar23 + -1;
                } while (uVar28 + 1 != lVar19);
                goto LAB_004ea0e4;
              }
              goto LAB_004ea0f6;
            }
            if ((long)uVar15 < 0) {
              if ((result->flag & 4) == 0) {
                do {
                  if (seqA == (char *)0x0) {
                    cVar8 = '*';
                  }
                  else {
                    cVar8 = seqA[lVar14 >> 0x20];
                  }
                  *pcVar25 = cVar8;
                  pcVar25 = pcVar25 + 1;
                  *local_1d8 = '-';
                  local_1d8 = local_1d8 + 1;
                  *pcVar20 = ' ';
                  pcVar20 = pcVar20 + 1;
                  lVar14 = lVar14 + -0x100000000;
                  lVar19 = local_198 + -1;
                  bVar7 = 0 < local_198;
                  local_198 = lVar19;
                } while (lVar19 != 0 && bVar7);
              }
              goto LAB_004ea0f6;
            }
            lVar18 = ((long)local_1d0 % lVar10 + uVar15 * lVar10) * uVar16 +
                     (long)local_1d0 / lVar10;
            if (iVar9 == 4) {
              uVar2 = *(ushort *)((long)piVar5 + lVar18 * 2);
              if ((uVar2 & 4) == 0) goto code_r0x004e95ef;
              if (seqA == (char *)0x0) {
                cVar8 = '*';
              }
              else {
                cVar8 = seqA[(int)local_1d0];
              }
              *pcVar25 = cVar8;
              *local_1d8 = seqB[uVar15];
              cVar8 = match_char(seqA,(int)local_1d0,seqB,(int)uVar15,matrix,match,pos,neg,
                                 case_sensitive,local_138,sVar29);
              *pcVar20 = cVar8;
              uVar15 = uVar15 - 1;
              iVar9 = 4;
              goto LAB_004e9753;
            }
            if (iVar9 != 1) goto LAB_004e965b;
            *pcVar25 = '-';
            *local_1d8 = seqB[uVar15];
            *pcVar20 = ' ';
            uVar2 = *(ushort *)((long)piVar5 + lVar18 * 2);
            iVar9 = 4;
            if (((uVar2 & 8) == 0) && (iVar9 = 1, (uVar2 & 0x10) == 0)) goto LAB_004ea26b;
            pcVar25 = pcVar25 + 1;
            local_1d8 = local_1d8 + 1;
            pcVar20 = pcVar20 + 1;
            uVar15 = uVar15 - 1;
            lVar19 = lVar19 + 1;
            pcVar23 = pcVar23 + -1;
          } while( true );
        }
        if (iVar9 + 1 == lena) {
          while (lVar14 = lVar14 + -1, iVar4 < lVar14) {
            *pcVar26 = '-';
            *pcVar13 = seqB[lVar14];
            *pcVar21 = ' ';
            pcVar13 = pcVar13 + 1;
            pcVar21 = pcVar21 + 1;
            pcVar26 = pcVar26 + 1;
          }
          goto LAB_004e954e;
        }
        if (iVar4 + 1 == lenb) {
          while (lVar19 = lVar19 + -1, (long)local_1d0 < lVar19) {
            if (seqA == (char *)0x0) {
              cVar8 = '*';
            }
            else {
              cVar8 = seqA[lVar19];
            }
            *pcVar26 = cVar8;
            *pcVar13 = '-';
            *pcVar21 = ' ';
            pcVar13 = pcVar13 + 1;
            pcVar21 = pcVar21 + 1;
            pcVar26 = pcVar26 + 1;
          }
          goto LAB_004e954e;
        }
LAB_004ea26b:
        pcVar13 = "parasail_result_get_traceback_striped_16";
      }
    }
    else {
      sVar29 = (size_t)(lena + lenb + 1);
      local_1b8 = (char *)malloc(sVar29);
      local_1c0 = (char *)malloc(sVar29);
      local_178 = (char *)malloc(sVar29);
      uVar15 = (ulong)(uVar3 >> 0x18 & 1);
      if ((uVar3 >> 0x19 & 1) != 0) {
        uVar15 = 2;
      }
      if ((uVar3 >> 0x1a & 1) != 0) {
        uVar15 = 4;
      }
      auVar30._0_4_ = -(uint)((uVar3 & 0x40000000) == 0);
      auVar30._4_4_ = -(uint)((uVar3 & 0x20000000) == 0);
      auVar30._8_4_ = -(uint)((uVar3 & 0x10000000) == 0);
      auVar30._12_4_ = -(uint)((uVar3 & 0x8000000) == 0);
      uVar17 = movmskps(4,auVar30);
      if ((uVar17 & 8) != 0) {
        uVar28 = uVar15;
      }
      if ((uVar17 & 4) != 0) {
        uVar16 = uVar28;
      }
      iVar9 = result->end_query;
      local_1d0 = (ulong)iVar9;
      uVar28 = 0x20;
      if ((uVar17 & 2) != 0) {
        uVar28 = uVar16;
      }
      iVar4 = result->end_ref;
      piVar5 = ((result->field_4).rowcols)->score_row;
      uVar16 = 0x40;
      if ((uVar17 & 1) != 0) {
        uVar16 = uVar28;
      }
      lVar10 = (long)(lVar19 + uVar16 + -1) / (long)uVar16;
      if (alphabet_aliases == (char *)0x0) {
        sVar29 = 0;
      }
      else {
        sVar29 = strlen(alphabet_aliases);
        if ((sVar29 & 0xffffffffffffff01) != 0) {
          pcVar13 = "parasail_result_get_traceback_striped_8";
          goto LAB_004ea2d1;
        }
        for (sVar27 = 0; sVar29 != sVar27; sVar27 = sVar27 + 1) {
          if (case_sensitive == 0) {
            pp_Var11 = __ctype_toupper_loc();
            cVar8 = (char)(*pp_Var11)[alphabet_aliases[sVar27]];
          }
          else {
            cVar8 = alphabet_aliases[sVar27];
          }
          local_138[sVar27] = cVar8;
        }
      }
      pcVar13 = local_1c0;
      pcVar21 = local_178;
      pcVar26 = local_1b8;
      if ((uVar3 & 2) == 0) {
LAB_004e8f17:
        local_198 = local_1d0 + 1;
        lVar14 = local_1d0 << 0x20;
        iVar9 = 4;
        uVar28 = (long)iVar4;
LAB_004e8f43:
        pcVar23 = seqB + uVar28;
        lVar19 = 0;
        pcVar20 = pcVar21;
        pcVar25 = pcVar26;
        uVar15 = uVar28;
        local_1d8 = pcVar13;
        do {
LAB_004e8f65:
          if ((long)(local_1d0 & uVar15) < 0) goto LAB_004ea0f6;
          if ((long)local_1d0 < 0) {
            if (((result->flag & 4) == 0) && (-1 < (long)uVar15)) {
              do {
                pcVar26[lVar19] = '-';
                pcVar13[lVar19] = *pcVar23;
                pcVar21[lVar19] = ' ';
                lVar19 = lVar19 + 1;
                pcVar23 = pcVar23 + -1;
              } while (uVar28 + 1 != lVar19);
              goto LAB_004ea0e4;
            }
            goto LAB_004ea0f6;
          }
          if ((long)uVar15 < 0) {
            if ((result->flag & 4) == 0) {
              do {
                if (seqA == (char *)0x0) {
                  cVar8 = '*';
                }
                else {
                  cVar8 = seqA[lVar14 >> 0x20];
                }
                *pcVar25 = cVar8;
                pcVar25 = pcVar25 + 1;
                *local_1d8 = '-';
                local_1d8 = local_1d8 + 1;
                *pcVar20 = ' ';
                pcVar20 = pcVar20 + 1;
                lVar14 = lVar14 + -0x100000000;
                lVar19 = local_198 + -1;
                bVar7 = 0 < local_198;
                local_198 = lVar19;
              } while (lVar19 != 0 && bVar7);
            }
            goto LAB_004ea0f6;
          }
          lVar18 = ((long)local_1d0 % lVar10 + uVar15 * lVar10) * uVar16 + (long)local_1d0 / lVar10;
          if (iVar9 == 4) {
            bVar1 = *(byte *)((long)piVar5 + lVar18);
            if ((bVar1 & 4) == 0) goto code_r0x004e8fb8;
            if (seqA == (char *)0x0) {
              cVar8 = '*';
            }
            else {
              cVar8 = seqA[(int)local_1d0];
            }
            *pcVar25 = cVar8;
            *local_1d8 = seqB[uVar15];
            cVar8 = match_char(seqA,(int)local_1d0,seqB,(int)uVar15,matrix,match,pos,neg,
                               case_sensitive,local_138,sVar29);
            *pcVar20 = cVar8;
            uVar15 = uVar15 - 1;
            iVar9 = 4;
            goto LAB_004e911c;
          }
          if (iVar9 != 1) goto LAB_004e9024;
          *pcVar25 = '-';
          *local_1d8 = seqB[uVar15];
          *pcVar20 = ' ';
          iVar9 = 4;
          if (((*(byte *)((long)piVar5 + lVar18) & 8) == 0) &&
             (iVar9 = 1, (*(byte *)((long)piVar5 + lVar18) & 0x10) == 0)) goto LAB_004ea1e9;
          pcVar25 = pcVar25 + 1;
          local_1d8 = local_1d8 + 1;
          pcVar20 = pcVar20 + 1;
          uVar15 = uVar15 - 1;
          lVar19 = lVar19 + 1;
          pcVar23 = pcVar23 + -1;
        } while( true );
      }
      if (iVar9 + 1 == lena) {
        while (lVar14 = lVar14 + -1, iVar4 < lVar14) {
          *pcVar26 = '-';
          *pcVar13 = seqB[lVar14];
          *pcVar21 = ' ';
          pcVar13 = pcVar13 + 1;
          pcVar21 = pcVar21 + 1;
          pcVar26 = pcVar26 + 1;
        }
        goto LAB_004e8f17;
      }
      if (iVar4 + 1 == lenb) {
        while (lVar19 = lVar19 + -1, (long)local_1d0 < lVar19) {
          if (seqA == (char *)0x0) {
            cVar8 = '*';
          }
          else {
            cVar8 = seqA[lVar19];
          }
          *pcVar26 = cVar8;
          *pcVar13 = '-';
          *pcVar21 = ' ';
          pcVar13 = pcVar13 + 1;
          pcVar21 = pcVar21 + 1;
          pcVar26 = pcVar26 + 1;
        }
        goto LAB_004e8f17;
      }
LAB_004ea1e9:
      pcVar13 = "parasail_result_get_traceback_striped_8";
    }
  }
  pcVar21 = "0 && \"internal error\"";
LAB_004ea2f9:
  fprintf(_stderr,"%s: assert(%s) failed\n",pcVar13,pcVar21);
  return (parasail_traceback_t *)0x0;
LAB_004e9227:
  *pcVar25 = '\0';
  *pcVar23 = '\0';
  *pcVar20 = '\0';
  ppVar12 = (parasail_traceback_t *)malloc(0x18);
  sVar29 = strlen(local_1b8);
  pcVar13 = parasail_reverse(local_1b8,sVar29);
  ppVar12->query = pcVar13;
  sVar29 = strlen(local_178);
  pcVar13 = parasail_reverse(local_178,sVar29);
  ppVar12->comp = pcVar13;
  goto LAB_004ea149;
code_r0x004e8fb8:
  iVar9 = 1;
  if (((bVar1 & 1) == 0) && (iVar9 = 2, (bVar1 & 2) == 0)) goto LAB_004ea0f6;
  goto LAB_004e8f65;
LAB_004e9024:
  if (iVar9 != 2) goto LAB_004ea1e9;
  if (seqA == (char *)0x0) {
    cVar8 = '*';
  }
  else {
    cVar8 = seqA[(int)local_1d0];
  }
  *pcVar25 = cVar8;
  *local_1d8 = '-';
  *pcVar20 = ' ';
  if ((*(byte *)((long)piVar5 + lVar18) & 0x20) == 0) {
    iVar9 = 2;
    if ((*(byte *)((long)piVar5 + lVar18) & 0x40) == 0) goto LAB_004ea1e9;
  }
  else {
    iVar9 = 4;
  }
LAB_004e911c:
  pcVar26 = pcVar25 + 1;
  local_1d0 = local_1d0 - 1;
  pcVar21 = pcVar20 + 1;
  pcVar13 = local_1d8 + 1;
  local_198 = local_198 + -1;
  lVar14 = lVar14 + -0x100000000;
  uVar28 = uVar15;
  goto LAB_004e8f43;
code_r0x004e95ef:
  iVar9 = 1;
  if (((uVar2 & 1) == 0) && (iVar9 = 2, (uVar2 & 2) == 0)) goto LAB_004ea0f6;
  goto LAB_004e959c;
LAB_004e965b:
  if (iVar9 != 2) goto LAB_004ea26b;
  if (seqA == (char *)0x0) {
    cVar8 = '*';
  }
  else {
    cVar8 = seqA[(int)local_1d0];
  }
  *pcVar25 = cVar8;
  *local_1d8 = '-';
  *pcVar20 = ' ';
  uVar2 = *(ushort *)((long)piVar5 + lVar18 * 2);
  if ((uVar2 & 0x20) == 0) {
    iVar9 = 2;
    if ((uVar2 & 0x40) == 0) goto LAB_004ea26b;
  }
  else {
    iVar9 = 4;
  }
LAB_004e9753:
  pcVar26 = pcVar25 + 1;
  local_1d0 = local_1d0 - 1;
  pcVar21 = pcVar20 + 1;
  pcVar13 = local_1d8 + 1;
  local_198 = local_198 + -1;
  lVar14 = lVar14 + -0x100000000;
  uVar28 = uVar15;
  goto LAB_004e957a;
code_r0x004e9ac9:
  iVar9 = 1;
  if (((uVar3 & 1) == 0) && (iVar9 = 2, (uVar3 & 2) == 0)) goto LAB_004ea0f6;
  goto LAB_004e9a77;
LAB_004e9b34:
  if (iVar9 != 2) goto LAB_004ea29f;
  if (seqA == (char *)0x0) {
    cVar8 = '*';
  }
  else {
    cVar8 = seqA[(int)local_1d0];
  }
  *pcVar25 = cVar8;
  *local_1d8 = '-';
  *pcVar20 = ' ';
  if ((piVar5[lVar18] & 0x20U) == 0) {
    iVar9 = 2;
    if ((piVar5[lVar18] & 0x40U) == 0) goto LAB_004ea29f;
  }
  else {
    iVar9 = 4;
  }
LAB_004e9c2b:
  pcVar26 = pcVar25 + 1;
  local_1d0 = local_1d0 - 1;
  pcVar21 = pcVar20 + 1;
  pcVar13 = local_1d8 + 1;
  local_198 = local_198 + -1;
  lVar14 = lVar14 + -0x100000000;
  uVar28 = uVar15;
  goto LAB_004e9a55;
LAB_004e9edc:
  if (iVar9 != 2) goto LAB_004ea2da;
  if (seqA == (char *)0x0) {
    cVar8 = '*';
  }
  else {
    cVar8 = seqA[(int)local_1d0];
  }
  *pcVar25 = cVar8;
  *local_1d8 = '-';
  *pcVar20 = ' ';
  if ((*(ulong *)(piVar5 + lVar18 * 2) & 0x20) == 0) {
    iVar9 = 2;
    if ((*(ulong *)(piVar5 + lVar18 * 2) & 0x40) == 0) goto LAB_004ea2da;
  }
  else {
    iVar9 = 4;
  }
LAB_004e9fd4:
  pcVar26 = pcVar25 + 1;
  local_1d0 = local_1d0 - 1;
  pcVar21 = pcVar20 + 1;
  pcVar13 = local_1d8 + 1;
  local_198 = local_198 + -1;
  lVar14 = lVar14 + -0x100000000;
  uVar28 = uVar15;
  goto LAB_004e9dfb;
LAB_004ea0f6:
  *pcVar25 = '\0';
  *local_1d8 = '\0';
  *pcVar20 = '\0';
  ppVar12 = (parasail_traceback_t *)malloc(0x18);
  sVar29 = strlen(local_1b8);
  pcVar13 = parasail_reverse(local_1b8,sVar29);
  ppVar12->query = pcVar13;
  sVar29 = strlen(local_178);
  pcVar13 = parasail_reverse(local_178,sVar29);
  ppVar12->comp = pcVar13;
LAB_004ea149:
  sVar29 = strlen(local_1c0);
  pcVar13 = parasail_reverse(local_1c0,sVar29);
  ppVar12->ref = pcVar13;
  free(local_1b8);
  free(local_1c0);
  free(local_178);
  return ppVar12;
}

Assistant:

parasail_traceback_t* parasail_result_get_traceback_extra(
        parasail_result_t *result,
        const char *seqA,
        int lena,
        const char *seqB,
        int lenb,
        const parasail_matrix_t *matrix,
        char match, char pos, char neg,
        int case_sensitive,
        const char *alphabet_aliases)
{
    PARASAIL_ASSERT(parasail_result_is_trace(result));

    if (result->flag & PARASAIL_FLAG_STRIPED
            || result->flag & PARASAIL_FLAG_SCAN) {
        if (result->flag & PARASAIL_FLAG_BITS_8) {
            return parasail_result_get_traceback_striped_8(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_16) {
            return parasail_result_get_traceback_striped_16(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_32) {
            return parasail_result_get_traceback_striped_32(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_64) {
            return parasail_result_get_traceback_striped_64(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
    }
    else {
        return parasail_result_get_traceback_8(
                result, seqA, lena, seqB, lenb,
                matrix, match, pos, neg,
                case_sensitive, alphabet_aliases);
    }

    return NULL; /* unreachable */
}